

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O3

void Aig_TsiStop(Aig_Tsi_t *p)

{
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  
  Aig_MmFixedStop(p->pMem,0);
  __ptr = p->vStates;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  if (p->pBins != (uint **)0x0) {
    free(p->pBins);
  }
  free(p);
  return;
}

Assistant:

void Aig_TsiStop( Aig_Tsi_t * p )
{
    Aig_MmFixedStop( p->pMem, 0 );
    Vec_PtrFree( p->vStates );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}